

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O0

bool crnlib::pixel_format_helpers::has_alpha(pixel_format fmt)

{
  bool local_9;
  pixel_format fmt_local;
  
  if (((((fmt == PIXEL_FMT_DXT5A) || (fmt == PIXEL_FMT_DXT2)) || (fmt == PIXEL_FMT_DXT3)) ||
      ((((fmt == PIXEL_FMT_DXT4 || (fmt == PIXEL_FMT_DXT5)) ||
        ((fmt == PIXEL_FMT_DXT1A || ((fmt == PIXEL_FMT_ETC2A || (fmt == PIXEL_FMT_A8R8G8B8)))))) ||
       (fmt == PIXEL_FMT_A8L8)))) ||
     (((fmt == PIXEL_FMT_A8 || (fmt == PIXEL_FMT_DXT5_AGBR)) || (fmt == PIXEL_FMT_ETC2AS)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

inline bool has_alpha(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_DXT1A:
            case PIXEL_FMT_DXT2:
            case PIXEL_FMT_DXT3:
            case PIXEL_FMT_DXT4:
            case PIXEL_FMT_DXT5:
            case PIXEL_FMT_DXT5A:
            case PIXEL_FMT_A8R8G8B8:
            case PIXEL_FMT_A8:
            case PIXEL_FMT_A8L8:
            case PIXEL_FMT_DXT5_AGBR:
            case PIXEL_FMT_ETC2A:
            case PIXEL_FMT_ETC2AS:
                return true;
            default:
                break;
            }
            return false;
        }